

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O1

char * construct_at_path_from_parts(Dwarf_Macro_Context mc)

{
  Dwarf_Small *fname;
  char *__s;
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s_00;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  
  if (mc->mc_file_path != (char *)0x0) {
    return mc->mc_file_path;
  }
  if ((mc->mc_at_comp_dir != (char *)0x0) && (*mc->mc_at_comp_dir != '\0')) {
    fname = (Dwarf_Small *)mc->mc_at_name;
    if ((fname == (Dwarf_Small *)0x0) || (*fname == '\0')) {
      return (char *)0x0;
    }
    iVar2 = _dwarf_file_name_is_full_path(fname);
    if (iVar2 == 0) {
      pcVar9 = mc->mc_at_comp_dir;
      __s = mc->mc_at_name;
      sVar3 = strlen(pcVar9);
      sVar4 = strlen(__s);
      __s_00 = (char *)malloc(sVar3 + sVar4 + 2);
      if (__s_00 == (char *)0x0) {
        __s_00 = (char *)0x0;
      }
      else {
        *__s_00 = '\0';
        pcVar1 = __s_00;
        pcVar5 = (char *)0x0;
        do {
          pcVar7 = pcVar5;
          pcVar5 = pcVar1;
          pcVar1 = pcVar5 + 1;
        } while (*pcVar5 != '\0');
        if ((pcVar7 != (char *)0x0) && (*pcVar7 == '/')) {
          *pcVar7 = '\0';
          pcVar5 = pcVar7;
        }
        cVar6 = *pcVar9;
        while (cVar6 != '\0') {
          pcVar9 = pcVar9 + 1;
          *pcVar5 = cVar6;
          pcVar5 = pcVar5 + 1;
          cVar6 = *pcVar9;
        }
        *pcVar5 = '\0';
        sVar3 = strlen(__s_00);
        (__s_00 + sVar3)[0] = '/';
        (__s_00 + sVar3)[1] = '\0';
        pcVar9 = __s_00;
        do {
          pcVar5 = pcVar9;
          pcVar9 = pcVar5 + 1;
        } while (*pcVar5 != '\0');
        cVar6 = *__s;
        if (cVar6 != '\0') {
          lVar8 = -1;
          do {
            pcVar9[lVar8] = cVar6;
            cVar6 = __s[lVar8 + 2];
            lVar8 = lVar8 + 1;
          } while (cVar6 != '\0');
          pcVar5 = pcVar9 + lVar8;
        }
        *pcVar5 = '\0';
      }
      mc->mc_file_path = __s_00;
      return __s_00;
    }
  }
  return mc->mc_at_name;
}

Assistant:

static const char *
construct_at_path_from_parts(Dwarf_Macro_Context mc)
{
    if (mc->mc_file_path) {
        return mc->mc_file_path;
    }
    if (!mc->mc_at_comp_dir || !mc->mc_at_comp_dir[0]) {
        return mc->mc_at_name;
    }
    if (!mc->mc_at_name || !mc->mc_at_name[0]) {
        return NULL;
    }
    if (_dwarf_file_name_is_full_path(
        (Dwarf_Small *)mc->mc_at_name)) {
        return mc->mc_at_name;
    }
    /* Dwarf_Macro_Context destructor will free this. */
    mc->mc_file_path = construct_from_dir_and_name(
        mc->mc_at_comp_dir,mc->mc_at_name);
    return mc->mc_file_path;
}